

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBQuantizeRow_C(uint8_t *dst_argb,int scale,int interval_size,int interval_offset,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)width;
  if (width < 1) {
    uVar6 = uVar5;
  }
  for (; (int)uVar6 != (int)uVar5; uVar5 = uVar5 + 1) {
    bVar1 = dst_argb[uVar5 * 4 + 1];
    bVar2 = dst_argb[uVar5 * 4 + 2];
    cVar4 = (char)interval_size;
    cVar3 = (char)interval_offset;
    dst_argb[uVar5 * 4] = (char)((uint)dst_argb[uVar5 * 4] * scale >> 0x10) * cVar4 + cVar3;
    dst_argb[uVar5 * 4 + 1] = (char)((uint)bVar1 * scale >> 0x10) * cVar4 + cVar3;
    dst_argb[uVar5 * 4 + 2] = (char)((uint)bVar2 * scale >> 0x10) * cVar4 + cVar3;
  }
  return;
}

Assistant:

void ARGBQuantizeRow_C(uint8_t* dst_argb,
                       int scale,
                       int interval_size,
                       int interval_offset,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    dst_argb[0] = (b * scale >> 16) * interval_size + interval_offset;
    dst_argb[1] = (g * scale >> 16) * interval_size + interval_offset;
    dst_argb[2] = (r * scale >> 16) * interval_size + interval_offset;
    dst_argb += 4;
  }
}